

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mysimulator.hh
# Opt level: O0

void __thiscall brown::MySimulator::MySimulator(MySimulator *this,Timer *timx,Timer *timy)

{
  Timer *timy_local;
  Timer *timx_local;
  MySimulator *this_local;
  
  Simulator::Simulator(&this->super_Simulator);
  (this->super_Simulator)._vptr_Simulator = (_func_int **)&PTR_hardwareLoop_00110d80;
  this->timx = timx;
  this->timy = timy;
  this->clk = 0;
  this->cx = 0;
  this->cy = 0;
  this->dirx = true;
  this->diry = true;
  this->isDown = false;
  return;
}

Assistant:

MySimulator(Timer& timx, Timer& timy):
        Simulator(), timx(timx), timy(timy) {}